

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O0

void gen_lfiwax(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t regno;
  TCGv_i64 EA_00;
  TCGv_i64 val;
  TCGv_i64 ret;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGv_i64 EA;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->fpu_enabled ^ 0xffU) & 1) == 0) {
    gen_set_access_type(ctx,0x30);
    EA_00 = tcg_temp_new_i64(tcg_ctx_00);
    val = tcg_temp_new_i64(tcg_ctx_00);
    ret = tcg_temp_new_i64(tcg_ctx_00);
    gen_addr_reg_index(ctx,EA_00);
    gen_qemu_ld32s(ctx,val,EA_00);
    tcg_gen_mov_i64_ppc64(tcg_ctx_00,ret,val);
    regno = rD(ctx->opcode);
    set_fpr(tcg_ctx_00,regno,ret);
    tcg_temp_free_i64(tcg_ctx_00,EA_00);
    tcg_temp_free_i64(tcg_ctx_00,val);
    tcg_temp_free_i64(tcg_ctx_00,ret);
  }
  else {
    gen_exception(ctx,7);
  }
  return;
}

Assistant:

static void gen_lfiwax(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv t0;
    TCGv_i64 t1;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    gen_set_access_type(ctx, ACCESS_FLOAT);
    EA = tcg_temp_new(tcg_ctx);
    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    gen_qemu_ld32s(ctx, t0, EA);
    tcg_gen_ext_tl_i64(tcg_ctx, t1, t0);
    set_fpr(tcg_ctx, rD(ctx->opcode), t1);
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
}